

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeIncrPopulate(IncrMerger *pIncr)

{
  uint nData;
  MergeEngine *pMVar1;
  sqlite3_file *psVar2;
  PmaReader *pPVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  u64 v;
  long in_FS_OFFSET;
  PmaWriter writer;
  int dummy;
  u8 aByte [10];
  PmaWriter local_88;
  long local_50;
  int local_48;
  uchar local_42 [10];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = pIncr->iStartOff;
  pMVar1 = pIncr->pMerger;
  psVar2 = pIncr->aFile[1].pFd;
  iVar6 = pIncr->pTask->pSorter->pgsz;
  local_88.iWriteOff = 0;
  local_88.pFd = (sqlite3_file *)0x0;
  local_88.nBuffer = 0;
  local_88.iBufStart = 0;
  local_88.iBufEnd = 0;
  local_88._28_4_ = 0;
  local_88.eFWErr = 0;
  local_88._4_4_ = 0;
  local_88.aBuffer = (u8 *)0x0;
  local_88.aBuffer = (u8 *)sqlite3Malloc((long)iVar6);
  if (local_88.aBuffer == (u8 *)0x0) {
    local_88.eFWErr = 7;
  }
  else {
    local_88.iWriteOff = lVar7 % (long)iVar6;
    iVar5 = (int)local_88.iWriteOff;
    local_88.iBufEnd = iVar5;
    local_88.iWriteOff = lVar7 - local_88.iWriteOff;
    local_88.iBufStart = iVar5;
    local_88.nBuffer = iVar6;
    local_88.pFd = psVar2;
  }
  local_50 = lVar7;
  do {
    pPVar3 = pMVar1->aReadr;
    iVar6 = pMVar1->aTree[1];
    if (pPVar3[iVar6].pFd == (sqlite3_file *)0x0) {
LAB_00144b02:
      iVar6 = vdbePmaWriterFinish(&local_88,&pIncr->aFile[1].iEof);
      goto LAB_00144b13;
    }
    nData = pPVar3[iVar6].nKey;
    v = (u64)(int)nData;
    lVar7 = 1;
    uVar8 = v;
    if (0x7f < nData) {
      do {
        lVar7 = lVar7 + 1;
        bVar4 = 0x3fff < uVar8;
        uVar8 = uVar8 >> 7;
      } while (bVar4);
    }
    if (pIncr->mxSz + local_50 < (long)(local_88.iWriteOff + v + (long)local_88.iBufEnd + lVar7))
    goto LAB_00144b02;
    iVar5 = sqlite3PutVarint(local_42,v);
    vdbePmaWriteBlob(&local_88,local_42,iVar5);
    vdbePmaWriteBlob(&local_88,pPVar3[iVar6].aKey,nData);
    iVar6 = vdbeMergeEngineStep(pIncr->pMerger,&local_48);
  } while (iVar6 == 0);
  vdbePmaWriterFinish(&local_88,&pIncr->aFile[1].iEof);
LAB_00144b13:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

static int vdbeIncrPopulate(IncrMerger *pIncr){
  int rc = SQLITE_OK;
  int rc2;
  i64 iStart = pIncr->iStartOff;
  SorterFile *pOut = &pIncr->aFile[1];
  SortSubtask *pTask = pIncr->pTask;
  MergeEngine *pMerger = pIncr->pMerger;
  PmaWriter writer;
  assert( pIncr->bEof==0 );

  vdbeSorterPopulateDebug(pTask, "enter");

  vdbePmaWriterInit(pOut->pFd, &writer, pTask->pSorter->pgsz, iStart);
  while( rc==SQLITE_OK ){
    int dummy;
    PmaReader *pReader = &pMerger->aReadr[ pMerger->aTree[1] ];
    int nKey = pReader->nKey;
    i64 iEof = writer.iWriteOff + writer.iBufEnd;

    /* Check if the output file is full or if the input has been exhausted.
    ** In either case exit the loop. */
    if( pReader->pFd==0 ) break;
    if( (iEof + nKey + sqlite3VarintLen(nKey))>(iStart + pIncr->mxSz) ) break;

    /* Write the next key to the output. */
    vdbePmaWriteVarint(&writer, nKey);
    vdbePmaWriteBlob(&writer, pReader->aKey, nKey);
    assert( pIncr->pMerger->pTask==pTask );
    rc = vdbeMergeEngineStep(pIncr->pMerger, &dummy);
  }

  rc2 = vdbePmaWriterFinish(&writer, &pOut->iEof);
  if( rc==SQLITE_OK ) rc = rc2;
  vdbeSorterPopulateDebug(pTask, "exit");
  return rc;
}